

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O2

void * matras_touch_no_check(matras *m,matras_id_t id)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  matras_id_t mVar4;
  matras_id_t mVar5;
  _Bool _Var6;
  void *pvVar7;
  void *ext;
  ulong uVar8;
  
  _Var6 = matras_needs_touch(m,id);
  if (!_Var6) {
    __assert_fail("matras_needs_touch(m, id)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x1cd,"void *matras_touch_no_check(struct matras *, matras_id_t)");
  }
  mVar4 = m->shift1;
  uVar1 = m->mask1;
  mVar5 = m->shift2;
  uVar2 = m->mask2;
  pvVar7 = (m->head).root;
  pvVar3 = ((m->head).prev_view)->root;
  if (pvVar7 == pvVar3) {
    pvVar7 = matras_copy_read_view_extent(m,pvVar7);
    if (pvVar7 != (void *)0x0) {
      (m->head).root = pvVar7;
      goto LAB_00103fa9;
    }
LAB_00104003:
    pvVar7 = (void *)0x0;
  }
  else {
LAB_00103fa9:
    uVar8 = (ulong)(id >> ((byte)mVar4 & 0x1f));
    ext = *(void **)((long)pvVar7 + uVar8 * 8);
    pvVar3 = *(void **)((long)pvVar3 + uVar8 * 8);
    if (ext == pvVar3) {
      ext = matras_copy_read_view_extent(m,ext);
      if (ext == (void *)0x0) goto LAB_00104003;
      *(void **)((long)pvVar7 + uVar8 * 8) = ext;
    }
    uVar8 = (ulong)((uVar1 & id) >> ((byte)mVar5 & 0x1f));
    pvVar7 = *(void **)((long)ext + uVar8 * 8);
    if (pvVar7 == *(void **)((long)pvVar3 + uVar8 * 8)) {
      pvVar7 = matras_copy_read_view_extent(m,pvVar7);
      if (pvVar7 == (void *)0x0) goto LAB_00104003;
      *(void **)((long)ext + uVar8 * 8) = pvVar7;
    }
    pvVar7 = (void *)((ulong)((id & uVar2) * m->block_size) + (long)pvVar7);
  }
  return pvVar7;
}

Assistant:

void *
matras_touch_no_check(struct matras *m, matras_id_t id)
{
	assert(matras_needs_touch(m, id));

	/* see "Shifts and masks explanation" for details */
	matras_id_t n1 = id >> m->shift1;
	matras_id_t n2 = (id & m->mask1) >> m->shift2;
	matras_id_t n3 = id & m->mask2;

	void **extent1 = (void **)m->head.root;
	void **extent1p = (void **)m->head.prev_view->root;
	if (extent1 == extent1p) {
		void *new_extent = matras_copy_read_view_extent(m, extent1);
		if (!new_extent)
			return 0;
		m->head.root = new_extent;
		extent1 = (void **)new_extent;
	}

	void **extent2 = (void **)extent1[n1];
	void **extent2p = (void **)extent1p[n1];
	if (extent2 == extent2p) {
		void *new_extent = matras_copy_read_view_extent(m, extent2);
		if (!new_extent)
			return 0;
		extent1[n1] = new_extent;
		extent2 = (void **)new_extent;
	}

	char *extent3 = (char *)extent2[n2];
	char *extent3p = (char *)extent2p[n2];
	if (extent3 == extent3p) {
		void *new_extent = matras_copy_read_view_extent(m, extent3);
		if (!new_extent)
			return 0;
		extent2[n2] = new_extent;
		extent3 = (char *)new_extent;
	}

	return &extent3[n3 * m->block_size];
}